

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68000_addx_rr_32(m68k_info *info)

{
  build_rr(info,6,'\x04',0);
  return;
}

Assistant:

static void d68000_addx_rr_32(m68k_info *info)
{
	build_rr(info, M68K_INS_ADDX, 4, 0);
}